

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

uint xmlHashValue(uint seed,xmlChar *key,xmlChar *key2,xmlChar *key3,size_t *lengths)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  
  uVar1 = seed ^ 0x3b00;
  uVar5 = seed << 0xf | seed >> 0x11;
  for (sVar6 = 0; key[sVar6] != 0; sVar6 = sVar6 + 1) {
    uVar1 = (uVar1 + key[sVar6]) * 9;
    uVar5 = ((uVar5 + uVar1) * 0x80 | uVar5 + uVar1 >> 0x19) * 5;
  }
  if (lengths != (size_t *)0x0) {
    *lengths = sVar6;
  }
  iVar2 = uVar1 * 9;
  iVar4 = ((uVar5 + iVar2) * 0x80 | uVar5 + iVar2 >> 0x19) * 5;
  if (key2 != (xmlChar *)0x0) {
    for (sVar6 = 0; key2[sVar6] != 0; sVar6 = sVar6 + 1) {
      iVar2 = (iVar2 + (uint)key2[sVar6]) * 9;
      iVar4 = ((iVar4 + iVar2) * 0x80 | (uint)(iVar4 + iVar2) >> 0x19) * 5;
    }
    if (lengths != (size_t *)0x0) {
      lengths[1] = sVar6;
    }
  }
  uVar5 = iVar2 * 9;
  uVar1 = ((iVar4 + uVar5) * 0x80 | iVar4 + uVar5 >> 0x19) * 5;
  if (key3 != (xmlChar *)0x0) {
    for (sVar6 = 0; key3[sVar6] != 0; sVar6 = sVar6 + 1) {
      uVar5 = (uVar5 + key3[sVar6]) * 9;
      uVar1 = ((uVar1 + uVar5) * 0x80 | uVar1 + uVar5 >> 0x19) * 5;
    }
    if (lengths != (size_t *)0x0) {
      lengths[2] = sVar6;
    }
  }
  uVar5 = (uVar1 << 0xe | uVar1 >> 0x12) + (uVar5 ^ uVar1);
  uVar3 = (uVar5 * 0x4000000 | uVar5 >> 6) + (uVar1 ^ uVar5);
  uVar1 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar5 ^ uVar3);
  return (uVar1 * 0x1000000 | uVar1 >> 8) + (uVar3 ^ uVar1);
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
xmlHashValue(unsigned seed, const xmlChar *key, const xmlChar *key2,
             const xmlChar *key3, size_t *lengths) {
    unsigned h1, h2;
    size_t i;

    HASH_INIT(h1, h2, seed);

    for (i = 0; key[i] != 0; i++) {
        HASH_UPDATE(h1, h2, key[i]);
    }
    if (lengths)
        lengths[0] = i;

    HASH_UPDATE(h1, h2, 0);

    if (key2 != NULL) {
        for (i = 0; key2[i] != 0; i++) {
            HASH_UPDATE(h1, h2, key2[i]);
        }
        if (lengths)
            lengths[1] = i;
    }

    HASH_UPDATE(h1, h2, 0);

    if (key3 != NULL) {
        for (i = 0; key3[i] != 0; i++) {
            HASH_UPDATE(h1, h2, key3[i]);
        }
        if (lengths)
            lengths[2] = i;
    }

    HASH_FINISH(h1, h2);

    return(h2);
}